

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QString * __thiscall
QDateTime::toString(QString *__return_storage_ptr__,QDateTime *this,DateFormat format)

{
  QArrayData *pQVar1;
  QChar *pQVar2;
  Data *pDVar3;
  uint uVar4;
  uint uVar5;
  QDateTimePrivate *pQVar6;
  qsizetype qVar7;
  char16_t *pcVar8;
  long in_FS_OFFSET;
  QLatin1StringView str;
  pair<QDate,_QTime> pVar9;
  QStringView format_00;
  QArrayData *local_b8;
  QSharedDataPointer<QLocalePrivate> QStack_b0;
  QChar *local_a8;
  qsizetype local_a0;
  QString local_98;
  QString local_78;
  undefined1 local_58 [8];
  QChar *pQStack_50;
  qsizetype local_48;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  pQVar6 = (this->d).d;
  if (((ulong)pQVar6 & 1) == 0) {
    pQVar6 = (QDateTimePrivate *)
             (ulong)(pQVar6->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  if (((ulong)pQVar6 & 8) != 0) {
    if ((format == ISODate) || (format == ISODateWithMs)) {
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      pQStack_50 = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
      pVar9 = getDateTime(&this->d);
      local_58 = (undefined1  [8])pVar9.first.jd;
      pQStack_50 = (QChar *)CONCAT44(pQStack_50._4_4_,pVar9.second.mds.mds);
      toStringIsoDate((QString *)&local_b8,(QDate)local_58);
      pcVar8 = local_78.d.ptr;
      pDVar3 = local_78.d.d;
      pQVar2 = local_a8;
      pQVar1 = local_b8;
      local_b8 = &(local_78.d.d)->super_QArrayData;
      local_78.d.d = (Data *)pQVar1;
      local_78.d.ptr = (char16_t *)QStack_b0.d.ptr;
      QStack_b0.d.ptr =
           (totally_ordered_wrapper<QLocalePrivate_*>)
           (totally_ordered_wrapper<QLocalePrivate_*>)pcVar8;
      local_a8 = (QChar *)local_78.d.size;
      local_78.d.size = (qsizetype)pQVar2;
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
      if ((QChar *)local_78.d.size == (QChar *)0x0) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        goto LAB_0035144f;
      }
      QTime::toString(&local_98,(QTime *)&pQStack_50,format);
      local_a0 = local_98.d.size;
      local_a8 = (QChar *)local_98.d.ptr;
      QStack_b0.d.ptr =
           (totally_ordered_wrapper<QLocalePrivate_*>)
           (totally_ordered_wrapper<QLocalePrivate_*>)local_98.d.d;
      local_b8 = (QArrayData *)CONCAT62(local_b8._2_6_,0x54);
      local_98.d.d = (Data *)0x0;
      local_98.d.ptr = (char16_t *)0x0;
      local_98.d.size = 0;
      ::operator+=(&local_78,(QStringBuilder<char16_t,_QString> *)&local_b8);
      if (QStack_b0.d.ptr != (QLocalePrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)QStack_b0.d.ptr)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)QStack_b0.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)QStack_b0.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)QStack_b0.d.ptr,2,0x10);
        }
      }
      if ((QLocalePrivate *)local_98.d.d != (QLocalePrivate *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar6 = (this->d).d;
      if (((ulong)pQVar6 & 1) == 0) {
        pQVar6 = (QDateTimePrivate *)
                 (ulong)(pQVar6->m_status).
                        super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                        super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
      }
      if (((uint)((ulong)pQVar6 >> 4) & 3) - 2 < 2) {
        uVar4 = offsetFromUtc(this);
        uVar5 = -uVar4;
        if (0 < (int)uVar4) {
          uVar5 = uVar4;
        }
        QString::asprintf((char **)&local_b8,"%c%02d%s%02d",
                          (ulong)(((int)uVar4 >> 0x1f) * -2 + 0x2b),(ulong)uVar5 / 0xe10,":",
                          (ulong)(uVar5 / 0x3c + (uVar5 / 0xe10) * -0x3c));
        QString::append(&local_78,(QString *)&local_b8);
        goto LAB_00351a50;
      }
      if (((ulong)pQVar6 >> 4 & 3) != 0) {
        QString::append(&local_78,(QChar)0x5a);
      }
    }
    else if (format == RFC2822Date) {
      QLocale::QLocale((QLocale *)&local_98,C,AnyScript,AnyCountry);
      format_00.m_data = L"dd MMM yyyy hh:mm:ss ";
      format_00.m_size = 0x15;
      QLocale::toString((QString *)&local_b8,(QLocale *)&local_98,this,format_00);
      pcVar8 = local_78.d.ptr;
      pDVar3 = local_78.d.d;
      pQVar2 = local_a8;
      pQVar1 = local_b8;
      local_b8 = &(local_78.d.d)->super_QArrayData;
      local_78.d.d = (Data *)pQVar1;
      local_78.d.ptr = (char16_t *)QStack_b0.d.ptr;
      QStack_b0.d.ptr =
           (totally_ordered_wrapper<QLocalePrivate_*>)
           (totally_ordered_wrapper<QLocalePrivate_*>)pcVar8;
      local_a8 = (QChar *)local_78.d.size;
      local_78.d.size = (qsizetype)pQVar2;
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
      QLocale::~QLocale((QLocale *)&local_98);
      uVar4 = offsetFromUtc(this);
      uVar5 = -uVar4;
      if (0 < (int)uVar4) {
        uVar5 = uVar4;
      }
      QString::asprintf((char **)&local_b8,"%c%02d%s%02d",(ulong)(((int)uVar4 >> 0x1f) * -2 + 0x2b),
                        (ulong)uVar5 / 0xe10,"",(ulong)(uVar5 / 0x3c + (uVar5 / 0xe10) * -0x3c));
      QString::append(&local_78,(QString *)&local_b8);
LAB_00351a50:
      if (local_b8 != (QArrayData *)0x0) {
        LOCK();
        (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_b8,2,0x10);
        }
      }
    }
    else {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      pVar9 = getDateTime(&this->d);
      local_38 = (undefined1 *)pVar9.first.jd;
      puStack_30 = (undefined1 *)CONCAT44(puStack_30._4_4_,pVar9.second.mds.mds);
      toStringTextDate((QString *)&local_b8,(QDate)local_38);
      pcVar8 = local_78.d.ptr;
      pDVar3 = local_78.d.d;
      pQVar2 = local_a8;
      pQVar1 = local_b8;
      local_b8 = &(local_78.d.d)->super_QArrayData;
      local_78.d.d = (Data *)pQVar1;
      local_78.d.ptr = (char16_t *)QStack_b0.d.ptr;
      QStack_b0.d.ptr =
           (totally_ordered_wrapper<QLocalePrivate_*>)
           (totally_ordered_wrapper<QLocalePrivate_*>)pcVar8;
      local_a8 = (QChar *)local_78.d.size;
      local_78.d.size = (qsizetype)pQVar2;
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
      qVar7 = QString::lastIndexOf(&local_78,(QChar)0x20,-1,CaseSensitive);
      QTime::toString((QString *)local_58,(QTime *)&puStack_30,TextDate);
      local_a0 = local_48;
      local_a8 = pQStack_50;
      QStack_b0.d.ptr =
           (totally_ordered_wrapper<QLocalePrivate_*>)
           (totally_ordered_wrapper<QLocalePrivate_*>)local_58;
      local_b8 = (QArrayData *)CONCAT62(local_b8._2_6_,0x20);
      local_58 = (undefined1  [8])0x0;
      pQStack_50 = (QChar *)0x0;
      local_48 = 0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>
                (&local_98,(QStringBuilder<char16_t,_QString> *)&local_b8);
      pcVar8 = local_98.d.ptr;
      if ((QChar *)local_98.d.ptr == (QChar *)0x0) {
        pcVar8 = L"";
      }
      QString::insert(&local_78,qVar7,(QChar *)pcVar8,local_98.d.size);
      if ((QLocalePrivate *)local_98.d.d != (QLocalePrivate *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (QStack_b0.d.ptr != (QLocalePrivate *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)QStack_b0.d.ptr)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)QStack_b0.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)QStack_b0.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)QStack_b0.d.ptr,2,0x10);
        }
      }
      if ((totally_ordered_wrapper<QLocalePrivate_*>)local_58 !=
          (totally_ordered_wrapper<QLocalePrivate_*>)0x0) {
        LOCK();
        *(int *)local_58 = *(int *)local_58 + -1;
        UNLOCK();
        if (*(int *)local_58 == 0) {
          QArrayData::deallocate((QArrayData *)local_58,2,0x10);
        }
      }
      pQVar6 = (this->d).d;
      if (((ulong)pQVar6 & 1) == 0) {
        uVar5 = (pQVar6->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
      }
      else {
        uVar5 = (uint)pQVar6;
      }
      uVar5 = uVar5 >> 4 & 3;
      if (uVar5 != 0) {
        if (uVar5 == 3) {
          QLocale::QLocale((QLocale *)local_58,C,AnyScript,AnyCountry);
          QTimeZone::displayName(&local_98,&pQVar6->m_timeZone,this,OffsetName,(QLocale *)local_58);
          local_a0 = local_98.d.size;
          local_a8 = (QChar *)local_98.d.ptr;
          QStack_b0.d.ptr =
               (totally_ordered_wrapper<QLocalePrivate_*>)
               (totally_ordered_wrapper<QLocalePrivate_*>)local_98.d.d;
          local_b8 = (QArrayData *)CONCAT62(local_b8._2_6_,0x20);
          local_98.d.d = (Data *)0x0;
          local_98.d.ptr = (char16_t *)0x0;
          local_98.d.size = 0;
          ::operator+=(&local_78,(QStringBuilder<char16_t,_QString> *)&local_b8);
          if (QStack_b0.d.ptr != (QLocalePrivate *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)QStack_b0.d.ptr)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)QStack_b0.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)QStack_b0.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)QStack_b0.d.ptr,2,0x10);
            }
          }
          if ((QLocalePrivate *)local_98.d.d != (QLocalePrivate *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
            }
          }
          QLocale::~QLocale((QLocale *)local_58);
        }
        else {
          str.m_data = " GMT";
          str.m_size = 4;
          QString::append(&local_78,str);
          pQVar6 = (this->d).d;
          if (((ulong)pQVar6 & 1) == 0) {
            pQVar6 = (QDateTimePrivate *)
                     (ulong)(pQVar6->m_status).
                            super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
          }
          if (((uint)pQVar6 & 0x30) == 0x20) {
            uVar4 = offsetFromUtc(this);
            uVar5 = -uVar4;
            if (0 < (int)uVar4) {
              uVar5 = uVar4;
            }
            QString::asprintf((char **)&local_b8,"%c%02d%s%02d",
                              (ulong)(((int)uVar4 >> 0x1f) * -2 + 0x2b),(ulong)uVar5 / 0xe10,"",
                              (ulong)(uVar5 / 0x3c + (uVar5 / 0xe10) * -0x3c));
            QString::append(&local_78,(QString *)&local_b8);
            goto LAB_00351a50;
          }
        }
      }
    }
  }
  qVar7 = local_78.d.size;
  pcVar8 = local_78.d.ptr;
  pDVar3 = local_78.d.d;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = pDVar3;
  (__return_storage_ptr__->d).ptr = pcVar8;
  local_78.d.size = 0;
  (__return_storage_ptr__->d).size = qVar7;
LAB_0035144f:
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QDateTime::toString(Qt::DateFormat format) const
{
    QString buf;
    if (!isValid())
        return buf;

    switch (format) {
    case Qt::RFC2822Date:
        buf = QLocale::c().toString(*this, u"dd MMM yyyy hh:mm:ss ");
        buf += toOffsetString(Qt::TextDate, offsetFromUtc());
        return buf;
    default:
    case Qt::TextDate: {
        const std::pair<QDate, QTime> p = getDateTime(d);
        buf = toStringTextDate(p.first);
        // Insert time between date's day and year:
        buf.insert(buf.lastIndexOf(u' '),
                   u' ' + p.second.toString(Qt::TextDate));
        // Append zone/offset indicator, as appropriate:
        switch (timeSpec()) {
        case Qt::LocalTime:
            break;
#if QT_CONFIG(timezone)
        case Qt::TimeZone:
            buf += u' ' + d->m_timeZone.displayName(
                *this, QTimeZone::OffsetName, QLocale::c());
            break;
#endif
        default:
#if 0 // ### Qt 7 GMT: use UTC instead, see qnamespace.qdoc documentation
            buf += " UTC"_L1;
#else
            buf += " GMT"_L1;
#endif
            if (getSpec(d) == Qt::OffsetFromUTC)
                buf += toOffsetString(Qt::TextDate, offsetFromUtc());
        }
        return buf;
    }
    case Qt::ISODate:
    case Qt::ISODateWithMs: {
        const std::pair<QDate, QTime> p = getDateTime(d);
        buf = toStringIsoDate(p.first);
        if (buf.isEmpty())
            return QString();   // failed to convert
        buf += u'T' + p.second.toString(format);
        switch (getSpec(d)) {
        case Qt::UTC:
            buf += u'Z';
            break;
        case Qt::OffsetFromUTC:
        case Qt::TimeZone:
            buf += toOffsetString(Qt::ISODate, offsetFromUtc());
            break;
        default:
            break;
        }
        return buf;
    }
    }
}